

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SetHasNullFlag(Vdbe *v,int iCur,int regHasNull)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Op *pOVar4;
  
  sqlite3VdbeAddOp3(v,0x38,0,regHasNull,0);
  iVar2 = sqlite3VdbeAddOp3(v,0x25,iCur,0,0);
  sqlite3VdbeAddOp3(v,0x60,iCur,0,regHasNull);
  iVar1 = v->nOp;
  if (0 < (long)iVar1) {
    v->aOp[(long)iVar1 + -1].p5 = 0x80;
  }
  if (v->db->mallocFailed == '\0') {
    iVar3 = iVar1 + -1;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    pOVar4 = v->aOp + iVar3;
  }
  else {
    pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar4->p2 = iVar1;
  return;
}

Assistant:

static void sqlite3SetHasNullFlag(Vdbe *v, int iCur, int regHasNull){
  int addr1;
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regHasNull);
  addr1 = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_Column, iCur, 0, regHasNull);
  sqlite3VdbeChangeP5(v, OPFLAG_TYPEOFARG);
  VdbeComment((v, "first_entry_in(%d)", iCur));
  sqlite3VdbeJumpHere(v, addr1);
}